

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endpoint.hpp
# Opt level: O1

void __thiscall
asio::ip::basic_endpoint<asio::ip::udp>::resize(basic_endpoint<asio::ip::udp> *this,size_t new_size)

{
  error_code __ec;
  error_code ec;
  error_code local_38;
  system_error local_28 [32];
  
  if (0x80 < new_size) {
    std::error_code::error_code<asio::error::basic_errors,void>(&local_38,invalid_argument);
    __ec._4_4_ = 0;
    __ec._M_value = local_38._M_value;
    if (local_38._M_value != 0) {
      __ec._M_cat = local_38._M_cat;
      std::system_error::system_error(local_28,__ec);
      asio::detail::throw_exception<std::system_error>(local_28);
      std::system_error::~system_error(local_28);
    }
  }
  return;
}

Assistant:

basic_endpoint(const basic_endpoint& other) noexcept
    : impl_(other.impl_)
  {
  }